

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
GenericValue(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
            MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  StringRefType local_30;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_local;
  
  local_20 = allocator;
  allocator_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)s;
  s_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  memset(this,0,0x10);
  StringRef<char>((rapidjson *)&local_30,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  allocator_local);
  SetStringRaw(this,&local_30,local_20);
  return;
}

Assistant:

GenericValue(const std::basic_string<Ch>& s, Allocator& allocator) : data_() { SetStringRaw(StringRef(s), allocator); }